

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeNewDb(Btree *p)

{
  int iVar1;
  int rc;
  Btree *p_local;
  
  sqlite3BtreeEnter(p);
  p->pBt->nPage = 0;
  iVar1 = newDatabase(p->pBt);
  sqlite3BtreeLeave(p);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeNewDb(Btree *p){
  int rc;
  sqlite3BtreeEnter(p);
  p->pBt->nPage = 0;
  rc = newDatabase(p->pBt);
  sqlite3BtreeLeave(p);
  return rc;
}